

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_min,void *p_max,
                        char *format,float power)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImDrawList *this_00;
  ImVec2 pos;
  ImVec2 IVar1;
  ImVec2 p_max_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiID id;
  ImU32 IVar5;
  int iVar6;
  byte bVar7;
  ImGuiCol idx;
  float fVar8;
  float fVar9;
  char *local_f8;
  ImRect frame_bb;
  ImRect grab_bb;
  ImVec2 local_90;
  ImRect total_bb;
  char value_buf [64];
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    fVar8 = CalcItemWidth();
    IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar9 = IVar1.x;
    text_baseline_y = (pIVar2->Style).FramePadding.y;
    frame_bb.Min.x = (this->DC).CursorPos.x;
    frame_bb.Min.y = (this->DC).CursorPos.y;
    frame_bb.Max.x = fVar8 + frame_bb.Min.x;
    frame_bb.Max.y = text_baseline_y + text_baseline_y + IVar1.y + frame_bb.Min.y;
    fVar8 = 0.0;
    if (0.0 < fVar9) {
      fVar8 = (pIVar2->Style).ItemInnerSpacing.x + fVar9;
    }
    total_bb.Max.x = fVar8 + frame_bb.Max.x;
    total_bb.Max.y = frame_bb.Max.y + 0.0;
    total_bb.Min.x = frame_bb.Min.x;
    total_bb.Min.y = frame_bb.Min.y;
    ItemSize(&total_bb,text_baseline_y);
    bVar3 = ItemAdd(&total_bb,id,&frame_bb);
    if (bVar3) {
      if (format == (char *)0x0) {
        if (9 < (uint)data_type) {
          __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                        ,0x68e,"const ImGuiDataTypeInfo *ImGui::DataTypeGetInfo(ImGuiDataType)");
        }
        local_f8 = GDataTypeInfo[(uint)data_type].PrintFmt;
      }
      else {
        local_f8 = format;
        if ((data_type == 4) && (((*format != '%' || (format[1] != 'd')) || (format[2] != '\0')))) {
          local_f8 = PatchFormatStringFloatToInt(format);
        }
      }
      bVar3 = ItemHoverable(&frame_bb,id);
      if ((GImGui->ActiveId == id) && (GImGui->TempInputTextId == id)) {
LAB_00202070:
        bVar3 = TempInputTextScalar(&frame_bb,id,label,data_type,p_data,local_f8);
        return bVar3;
      }
      bVar4 = FocusableItemRegister(this,id);
      if (bVar3) {
        bVar7 = (pIVar2->IO).MouseClicked[0];
      }
      else {
        bVar7 = 0;
      }
      if (((bVar4 || (bVar7 & 1) != 0) || (pIVar2->NavActivateId == id)) ||
         (pIVar2->NavInputId == id)) {
        SetActiveID(id,this);
        SetFocusID(id,this);
        FocusWindow(this);
        *(byte *)&pIVar2->ActiveIdUsingNavDirMask = (byte)pIVar2->ActiveIdUsingNavDirMask | 3;
        if ((bVar4) ||
           (((bVar7 != 0 && ((pIVar2->IO).KeyCtrl != false)) || (pIVar2->NavInputId == id)))) {
          FocusableItemUnregister(this);
          goto LAB_00202070;
        }
      }
      idx = 9;
      if (pIVar2->ActiveId != id) {
        idx = (pIVar2->HoveredId == id) + 7;
      }
      IVar5 = GetColorU32(idx,1.0);
      RenderNavHighlight(&frame_bb,id,1);
      IVar1.y = frame_bb.Min.y;
      IVar1.x = frame_bb.Min.x;
      p_max_00.y = frame_bb.Max.y;
      p_max_00.x = frame_bb.Max.x;
      RenderFrame(IVar1,p_max_00,IVar5,true,(pIVar2->Style).FrameRounding);
      grab_bb.Min.x = 0.0;
      grab_bb.Min.y = 0.0;
      grab_bb.Max.x = 0.0;
      grab_bb.Max.y = 0.0;
      bVar3 = SliderBehavior(&frame_bb,id,data_type,p_data,p_min,p_max,local_f8,power,0,&grab_bb);
      if (bVar3) {
        MarkItemEdited(id);
      }
      if (grab_bb.Min.x < grab_bb.Max.x) {
        this_00 = this->DrawList;
        IVar5 = GetColorU32((pIVar2->ActiveId == id) + 0x13,1.0);
        ImDrawList::AddRectFilled
                  (this_00,&grab_bb.Min,&grab_bb.Max,IVar5,(pIVar2->Style).GrabRounding,0xf);
      }
      iVar6 = DataTypeFormatString(value_buf,0x40,data_type,p_data,local_f8);
      local_90.x = 0.5;
      local_90.y = 0.5;
      RenderTextClipped(&frame_bb.Min,&frame_bb.Max,value_buf,value_buf + iVar6,(ImVec2 *)0x0,
                        &local_90,(ImRect *)0x0);
      if (fVar9 <= 0.0) {
        return bVar3;
      }
      pos.y = (pIVar2->Style).FramePadding.y + frame_bb.Min.y;
      pos.x = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
      RenderText(pos,label,(char *)0x0,true);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}